

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixFullPathname(sqlite3_vfs *pVfs,char *zPath,int nOut,char *zOut)

{
  long lVar1;
  uint *puVar2;
  int iVar3;
  long in_FS_OFFSET;
  char zPwd [4098];
  DbPath local_1050;
  char local_1038 [4112];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_1050.rc = 0;
  local_1050.nSymlink = 0;
  local_1050.nUsed = 0;
  local_1050.zOut = zOut;
  local_1050.nOut = nOut;
  if (*zPath != '/') {
    memset(local_1038,0xaa,0x1002);
    lVar1 = (*aSyscall[3].pCurrent)(local_1038,0x1000);
    if (lVar1 == 0) {
      iVar3 = 0xe;
      sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xb0fc,
                  "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
      puVar2 = (uint *)__errno_location();
      sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0xb0fc,(ulong)*puVar2,"getcwd",zPath,"");
      goto LAB_00120fb7;
    }
    appendAllPathElements(&local_1050,local_1038);
  }
  appendAllPathElements(&local_1050,zPath);
  zOut[local_1050.nUsed] = '\0';
  if (((long)local_1050.nUsed < 2) || (local_1050.rc != 0)) {
    iVar3 = 0xe;
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xb102,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  }
  else {
    iVar3 = (uint)(local_1050.nSymlink != 0) << 9;
  }
LAB_00120fb7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int unixFullPathname(
  sqlite3_vfs *pVfs,            /* Pointer to vfs object */
  const char *zPath,            /* Possibly relative input path */
  int nOut,                     /* Size of output buffer in bytes */
  char *zOut                    /* Output buffer */
){
  DbPath path;
  UNUSED_PARAMETER(pVfs);
  path.rc = 0;
  path.nUsed = 0;
  path.nSymlink = 0;
  path.nOut = nOut;
  path.zOut = zOut;
  if( zPath[0]!='/' ){
    char zPwd[SQLITE_MAX_PATHLEN+2];
    if( osGetcwd(zPwd, sizeof(zPwd)-2)==0 ){
      return unixLogError(SQLITE_CANTOPEN_BKPT, "getcwd", zPath);
    }
    appendAllPathElements(&path, zPwd);
  }
  appendAllPathElements(&path, zPath);
  zOut[path.nUsed] = 0;
  if( path.rc || path.nUsed<2 ) return SQLITE_CANTOPEN_BKPT;
  if( path.nSymlink ) return SQLITE_OK_SYMLINK;
  return SQLITE_OK;
}